

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::render
          (InvalidateSubFboUnbindBlitCase *this,Surface *dst)

{
  float fVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int width;
  int srcX1;
  int *piVar7;
  Context *pCVar8;
  float *pfVar9;
  size_type sVar10;
  reference attachments_00;
  bool local_28a;
  bool local_289;
  int local_27c;
  int local_274;
  Vector<float,_3> local_268;
  Vector<float,_3> local_25c;
  Vector<float,_4> local_250;
  Vector<float,_3> local_240;
  Vector<float,_3> local_234;
  Vector<float,_4> local_228;
  Vector<float,_3> local_218;
  Vector<float,_3> local_20c;
  Vector<float,_4> local_200;
  deUint32 local_1f0;
  deUint32 flatShaderID;
  undefined1 local_1e0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  int blitY1;
  int blitX1;
  int blitY0;
  int blitX0;
  int invalidateH;
  int invalidateW;
  int invalidateY;
  int invalidateX;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  bool stencil;
  bool depth;
  TextureFormat depthStencilFmt;
  Vec2 quadNDCRightTopXY;
  Vec2 quadNDCSize;
  Vec2 quadNDCLeftBottomXY;
  IVec2 quadSizePixels;
  Surface *dst_local;
  InvalidateSubFboUnbindBlitCase *this_local;
  
  if (this->m_numSamples == 0) {
    local_274 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  }
  else {
    iVar4 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
    local_274 = de::min<int>(0x80,iVar4);
  }
  if (this->m_numSamples == 0) {
    local_27c = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  }
  else {
    iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
    local_27c = de::min<int>(0x80,iVar4);
  }
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&quadNDCLeftBottomXY,local_274,local_27c);
  tcu::Vector<float,_2>::Vector(&quadNDCSize,-1.0,-1.0);
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar4 = *piVar7;
  iVar5 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar2 = *piVar7;
  iVar6 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  tcu::Vector<float,_2>::Vector
            (&quadNDCRightTopXY,((float)iVar4 * 2.0) / (float)iVar5,
             ((float)iVar2 * 2.0) / (float)iVar6);
  tcu::operator+((tcu *)&depthStencilFmt,&quadNDCSize,&quadNDCRightTopXY);
  if (this->m_depthStencilFmt == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)&fbo);
  }
  else {
    _fbo = glu::mapGLInternalFormat(this->m_depthStencilFmt);
  }
  local_289 = fbo == 0x12 || fbo == 0x14;
  colorRbo._3_1_ = local_289;
  local_28a = fbo == 0x13 || fbo == 0x14;
  colorRbo._2_1_ = local_28a;
  depthStencilRbo = 0;
  invalidateX = 0;
  invalidateY = 0;
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
  width = *piVar7 / 2;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar4 = *piVar7;
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
  srcX1 = width + *piVar7 / 2;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar2 = *piVar7;
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0,
             this->m_invalidateBuffers);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_1f0 = (*pCVar8->_vptr_Context[0x75])
                        (pCVar8,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateX);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,invalidateX);
  dVar3 = this->m_colorFmt;
  iVar5 = this->m_numSamples;
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar6 = *piVar7;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
  sglr::ContextWrapper::glRenderbufferStorageMultisample
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,iVar5,dVar3,iVar6,*piVar7);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateY);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,invalidateY);
    dVar3 = this->m_depthStencilFmt;
    iVar5 = this->m_numSamples;
    piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
    iVar6 = *piVar7;
    piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,iVar5,dVar3,iVar6,*piVar7);
  }
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,invalidateX);
  if ((colorRbo._3_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,invalidateY);
  }
  if ((colorRbo._2_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,invalidateY);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar3 = local_1f0;
  tcu::Vector<float,_4>::Vector(&local_200,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar8,dVar3,&local_200);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar3 = local_1f0;
  pfVar9 = tcu::Vector<float,_2>::x(&quadNDCSize);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&quadNDCSize);
  tcu::Vector<float,_3>::Vector(&local_20c,fVar1,*pfVar9,-1.0);
  pfVar9 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&depthStencilFmt);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&depthStencilFmt);
  tcu::Vector<float,_3>::Vector(&local_218,fVar1,*pfVar9,1.0);
  sglr::drawQuad(pCVar8,dVar3,&local_20c,&local_218);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
  attachments_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0,0);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar10,attachments_00,0,0,
             width,iVar4);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,0);
  sglr::ContextWrapper::glBlitFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,width,0,srcX1,iVar2,width,0,srcX1,iVar2
             ,~this->m_invalidateBuffers & 0x4500,0x2600);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,0);
  if ((this->m_invalidateBuffers & 0x4000) != 0) {
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar3 = local_1f0;
    tcu::Vector<float,_4>::Vector(&local_228,0.0,1.0,0.0,1.0);
    FboTestUtil::FlatColorShader::setColor
              ((FlatColorShader *)
               &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pCVar8,dVar3,&local_228);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar3 = local_1f0;
    pfVar9 = tcu::Vector<float,_2>::x(&quadNDCSize);
    fVar1 = *pfVar9;
    pfVar9 = tcu::Vector<float,_2>::y(&quadNDCSize);
    tcu::Vector<float,_3>::Vector(&local_234,fVar1,*pfVar9,0.0);
    pfVar9 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&depthStencilFmt);
    fVar1 = *pfVar9;
    pfVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&depthStencilFmt);
    tcu::Vector<float,_3>::Vector(&local_240,fVar1,*pfVar9,0.0);
    sglr::drawQuad(pCVar8,dVar3,&local_234,&local_240);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  }
  if ((this->m_invalidateBuffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  }
  if ((this->m_invalidateBuffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar3 = local_1f0;
  tcu::Vector<float,_4>::Vector(&local_250,0.0,0.0,1.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar8,dVar3,&local_250);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar3 = local_1f0;
  pfVar9 = tcu::Vector<float,_2>::x(&quadNDCSize);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y(&quadNDCSize);
  tcu::Vector<float,_3>::Vector(&local_25c,fVar1,*pfVar9,0.0);
  pfVar9 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&depthStencilFmt);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&depthStencilFmt);
  tcu::Vector<float,_3>::Vector(&local_268,fVar1,*pfVar9,0.0);
  sglr::drawQuad(pCVar8,dVar3,&local_25c,&local_268);
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&quadNDCLeftBottomXY);
  iVar4 = *piVar7;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&quadNDCLeftBottomXY);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar4,*piVar7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
  FboTestUtil::FlatColorShader::~FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		// \note When using fullscreen viewport (when m_numSamples > 0), still only use a 128x128 pixel quad at most.
		IVec2					quadSizePixels			(m_numSamples == 0 ? getWidth() : de::min(128, getWidth()),
														 m_numSamples == 0 ? getHeight() : de::min(128, getHeight()));
		Vec2					quadNDCLeftBottomXY		(-1.0f, -1.0f);
		Vec2					quadNDCSize				(2.0f*(float)quadSizePixels.x()/(float)getWidth(), 2.0f*(float)quadSizePixels.y()/(float)getHeight());
		Vec2					quadNDCRightTopXY		= quadNDCLeftBottomXY + quadNDCSize;
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		int						invalidateX				= 0;
		int						invalidateY				= 0;
		int						invalidateW				= quadSizePixels.x()/2;
		int						invalidateH				= quadSizePixels.y();
		int						blitX0					= invalidateW;
		int						blitY0					= 0;
		int						blitX1					= blitX0 + quadSizePixels.x()/2;
		int						blitY1					= blitY0 + quadSizePixels.y();
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenRenderbuffers					(1, &colorRbo);
		glBindRenderbuffer					(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_colorFmt, quadSizePixels.x(), quadSizePixels.y());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers					(1, &depthStencilRbo);
			glBindRenderbuffer					(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_depthStencilFmt, quadSizePixels.x(), quadSizePixels.y());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), -1.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Set default framebuffer as draw framebuffer and blit preserved buffers.
		glBindFramebuffer	(GL_DRAW_FRAMEBUFFER, 0);
		glBlitFramebuffer	(blitX0, blitY0, blitX1, blitY1, blitX0, blitY0, blitX1, blitY1, (GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT) & ~m_invalidateBuffers, GL_NEAREST);
		glBindFramebuffer	(GL_READ_FRAMEBUFFER, 0);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_invalidateBuffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

		readPixels(dst, 0, 0, quadSizePixels.x(), quadSizePixels.y());
	}